

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O2

Result __thiscall HostUI::init_gl(HostUI *this)

{
  Result RVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLint GVar5;
  Result RVar6;
  GLuint fs;
  GLuint vs;
  
  RVar6 = ERROR;
  (*glGenBuffers)(1,&this->vbo);
  (*glGenBuffers)(1,&this->ebo);
  RVar1 = host_gl_shader(0x8b31,
                         "in vec2 aPos;\nin vec2 aUV;\nin vec4 aColor;\nout vec2 vUV;\nout vec4 vColor;\nuniform mat3 uProjMatrix;\nvoid main(void) {\n  gl_Position = vec4(uProjMatrix * vec3(aPos, 1.0), 1.0);\n  vUV = aUV;\n  vColor = aColor;\n}\n"
                         ,&vs);
  if (RVar1 == OK) {
    RVar1 = host_gl_shader(0x8b30,
                           "in vec2 vUV;\nin vec4 vColor;\nout vec4 oColor;\nuniform int uUsePalette;\nuniform vec4 uPalette[4];\nuniform sampler2D uSampler;\nvoid main(void) {\n  vec4 color = vColor * texture(uSampler, vUV);\n  if (uUsePalette != 0) {\n    color = uPalette[int(clamp(color.x * 256.0, 0.0, 3.0))];\n  }\n  oColor = color;\n}\n"
                           ,&fs);
    if (RVar1 == OK) {
      RVar1 = host_gl_program(vs,fs,&this->program);
      if (RVar1 == OK) {
        GVar2 = (*glGetAttribLocation)(this->program,"aPos");
        GVar3 = (*glGetAttribLocation)(this->program,"aUV");
        GVar4 = (*glGetAttribLocation)(this->program,"aColor");
        GVar5 = (*glGetUniformLocation)(this->program,"uProjMatrix");
        this->uProjMatrix = GVar5;
        GVar5 = (*glGetUniformLocation)(this->program,"uSampler");
        this->uSampler = GVar5;
        GVar5 = (*glGetUniformLocation)(this->program,"uUsePalette");
        this->uUsePalette = GVar5;
        GVar5 = (*glGetUniformLocation)(this->program,"uPalette[0]");
        this->uPalette = GVar5;
        (*glGenVertexArrays)(1,&this->vao);
        (*glBindVertexArray)(this->vao);
        (*glBindBuffer)(0x8892,this->vbo);
        (*glEnableVertexAttribArray)(GVar2);
        (*glEnableVertexAttribArray)(GVar3);
        (*glEnableVertexAttribArray)(GVar4);
        RVar6 = OK;
        (*glVertexAttribPointer)(GVar2,2,0x1406,'\0',0x14,(void *)0x0);
        (*glVertexAttribPointer)(GVar3,2,0x1406,'\0',0x14,(void *)0x8);
        (*glVertexAttribPointer)(GVar4,4,0x1401,'\x01',0x14,(void *)0x10);
      }
    }
  }
  return RVar6;
}

Assistant:

Result HostUI::init_gl() {
  static const char* s_vertex_shader =
      "in vec2 aPos;\n"
      "in vec2 aUV;\n"
      "in vec4 aColor;\n"
      "out vec2 vUV;\n"
      "out vec4 vColor;\n"
      "uniform mat3 uProjMatrix;\n"
      "void main(void) {\n"
      "  gl_Position = vec4(uProjMatrix * vec3(aPos, 1.0), 1.0);\n"
      "  vUV = aUV;\n"
      "  vColor = aColor;\n"
      "}\n";

  static const char* s_fragment_shader =
      "in vec2 vUV;\n"
      "in vec4 vColor;\n"
      "out vec4 oColor;\n"
      "uniform int uUsePalette;\n"
      "uniform vec4 uPalette[4];\n"
      "uniform sampler2D uSampler;\n"
      "void main(void) {\n"
      "  vec4 color = vColor * texture(uSampler, vUV);\n"
      "  if (uUsePalette != 0) {\n"
      "    color = uPalette[int(clamp(color.x * 256.0, 0.0, 3.0))];\n"
      "  }\n"
      "  oColor = color;\n"
      "}\n";

  glGenBuffers(1, &vbo);
  glGenBuffers(1, &ebo);

  GLuint vs, fs;
  if (!SUCCESS(host_gl_shader(GL_VERTEX_SHADER, s_vertex_shader, &vs)) ||
      !SUCCESS(host_gl_shader(GL_FRAGMENT_SHADER, s_fragment_shader, &fs)) ||
      !SUCCESS(host_gl_program(vs, fs, &program))) {
    return ERROR;
  }

  GLint aPos = glGetAttribLocation(program, "aPos");
  GLint aUV = glGetAttribLocation(program, "aUV");
  GLint aColor = glGetAttribLocation(program, "aColor");
  uProjMatrix = glGetUniformLocation(program, "uProjMatrix");
  uSampler = glGetUniformLocation(program, "uSampler");
  uUsePalette = glGetUniformLocation(program, "uUsePalette");
  uPalette = glGetUniformLocation(program, "uPalette[0]");

  glGenVertexArrays(1, &vao);
  glBindVertexArray(vao);
  glBindBuffer(GL_ARRAY_BUFFER, vbo);
  glEnableVertexAttribArray(aPos);
  glEnableVertexAttribArray(aUV);
  glEnableVertexAttribArray(aColor);
  glVertexAttribPointer(aPos, 2, GL_FLOAT, GL_FALSE, sizeof(ImDrawVert),
                        (void*)offsetof(ImDrawVert, pos));
  glVertexAttribPointer(aUV, 2, GL_FLOAT, GL_FALSE, sizeof(ImDrawVert),
                        (void*)offsetof(ImDrawVert, uv));
  glVertexAttribPointer(aColor, 4, GL_UNSIGNED_BYTE, GL_TRUE,
                        sizeof(ImDrawVert), (void*)offsetof(ImDrawVert, col));

  return OK;
}